

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

void __thiscall
Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
          (SparseMatrix<double,1,int> *this,SparseMatrix<double,_1,_int> *other)

{
  Index rows;
  Index cols;
  SparseMatrix<double,_1,_int> *other_local;
  SparseMatrix<double,_1,_int> *this_local;
  
  rows = SparseMatrix<double,_1,_int>::rows(other);
  cols = SparseMatrix<double,_1,_int>::cols(other);
  SparseMatrix<double,_1,_int>::resize((SparseMatrix<double,_1,_int> *)this,rows,cols);
  if (*(long *)(this + 0x20) != 0) {
    free(*(void **)(this + 0x20));
    *(undefined8 *)(this + 0x20) = 0;
  }
  return;
}

Assistant:

void initAssignment(const Other& other)
    {
      resize(other.rows(), other.cols());
      if(m_innerNonZeros)
      {
        std::free(m_innerNonZeros);
        m_innerNonZeros = 0;
      }
    }